

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.cpp
# Opt level: O1

WindowBoundsSet *
duckdb::WindowBoundariesState::GetWindowBounds
          (WindowBoundsSet *__return_storage_ptr__,BoundWindowExpression *wexpr)

{
  pointer puVar1;
  pointer puVar2;
  pointer pBVar3;
  pointer pBVar4;
  size_type sVar5;
  InternalException *this;
  ExpressionType type;
  __hashtable *__h;
  __node_gen_type __node_gen;
  key_type local_71;
  string local_70;
  string local_50;
  
  puVar1 = (wexpr->partitions).
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar2 = (wexpr->partitions).
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pBVar3 = (wexpr->orders).
           super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pBVar4 = (wexpr->orders).
           super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
  switch((wexpr->super_Expression).super_BaseExpression.type) {
  case WINDOW_AGGREGATE:
  case WINDOW_FIRST_VALUE:
  case WINDOW_LAST_VALUE:
  case WINDOW_NTH_VALUE:
    local_71 = FRAME_BEGIN;
    ::std::
    _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
              ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)__return_storage_ptr__);
    local_71 = FRAME_END;
    local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
    ::std::
    _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
              ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)__return_storage_ptr__);
    break;
  default:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"Window expression type %s","");
    ExpressionTypeToString_abi_cxx11_
              (&local_50,(duckdb *)(ulong)(wexpr->super_Expression).super_BaseExpression.type,type);
    InternalException::InternalException<std::__cxx11::string>(this,&local_70,&local_50);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case WINDOW_RANK:
    if ((wexpr->arg_orders).
        super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
        super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (wexpr->arg_orders).
        super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
        super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      local_71 = PARTITION_BEGIN;
      ::std::
      _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
                ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)__return_storage_ptr__);
      local_71 = PEER_BEGIN;
      local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
      ::std::
      _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
                ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)__return_storage_ptr__);
    }
    else {
      local_71 = FRAME_BEGIN;
      ::std::
      _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
                ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)__return_storage_ptr__);
      local_71 = FRAME_END;
      local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
      ::std::
      _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
                ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)__return_storage_ptr__);
      local_71 = PEER_BEGIN;
      local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
      ::std::
      _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
                ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)__return_storage_ptr__);
    }
    break;
  case WINDOW_RANK_DENSE:
    local_71 = PARTITION_BEGIN;
    ::std::
    _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
              ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)__return_storage_ptr__);
    local_71 = PEER_BEGIN;
    local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
    ::std::
    _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
              ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)__return_storage_ptr__);
    break;
  case WINDOW_NTILE:
    if ((wexpr->arg_orders).
        super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
        super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (wexpr->arg_orders).
        super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
        super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      local_71 = PARTITION_BEGIN;
      ::std::
      _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
                ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)__return_storage_ptr__);
      local_71 = PARTITION_END;
      local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
      ::std::
      _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
                ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)__return_storage_ptr__);
    }
    else {
      local_71 = FRAME_BEGIN;
      ::std::
      _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
                ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)__return_storage_ptr__);
      local_71 = FRAME_END;
      local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
      ::std::
      _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
                ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)__return_storage_ptr__);
    }
    break;
  case WINDOW_PERCENT_RANK:
    if ((wexpr->arg_orders).
        super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
        super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (wexpr->arg_orders).
        super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
        super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      local_71 = PARTITION_BEGIN;
      ::std::
      _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
                ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)__return_storage_ptr__);
      local_71 = PARTITION_END;
      local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
      ::std::
      _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
                ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)__return_storage_ptr__);
      local_71 = PEER_BEGIN;
      local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
      ::std::
      _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
                ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)__return_storage_ptr__);
    }
    else {
      local_71 = FRAME_BEGIN;
      ::std::
      _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
                ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)__return_storage_ptr__);
      local_71 = FRAME_END;
      local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
      ::std::
      _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
                ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)__return_storage_ptr__);
      local_71 = PEER_BEGIN;
      local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
      ::std::
      _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
                ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)__return_storage_ptr__);
    }
    break;
  case WINDOW_CUME_DIST:
    if ((wexpr->arg_orders).
        super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
        super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (wexpr->arg_orders).
        super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
        super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      local_71 = PARTITION_BEGIN;
      ::std::
      _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
                ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)__return_storage_ptr__);
      local_71 = PARTITION_END;
      local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
      ::std::
      _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
                ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)__return_storage_ptr__);
      local_71 = PEER_END;
      local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
      ::std::
      _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
                ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)__return_storage_ptr__);
    }
    else {
      local_71 = FRAME_BEGIN;
      ::std::
      _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
                ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)__return_storage_ptr__);
      local_71 = FRAME_END;
      local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
      ::std::
      _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
                ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)__return_storage_ptr__);
      local_71 = PEER_END;
      local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
      ::std::
      _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
                ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)__return_storage_ptr__);
    }
    break;
  case WINDOW_ROW_NUMBER:
    if ((wexpr->arg_orders).
        super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
        super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (wexpr->arg_orders).
        super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
        super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      local_71 = PARTITION_BEGIN;
      ::std::
      _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
                ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)__return_storage_ptr__);
    }
    else {
      local_71 = FRAME_BEGIN;
      ::std::
      _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
                ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)__return_storage_ptr__);
      local_71 = FRAME_END;
      local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
      ::std::
      _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
                ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)__return_storage_ptr__);
    }
    break;
  case WINDOW_LEAD:
  case WINDOW_LAG:
    if ((wexpr->arg_orders).
        super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
        super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (wexpr->arg_orders).
        super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
        super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      local_71 = PARTITION_BEGIN;
      ::std::
      _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
                ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)__return_storage_ptr__);
      local_71 = PARTITION_END;
      local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
      ::std::
      _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
                ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)__return_storage_ptr__);
    }
    else {
      local_71 = FRAME_BEGIN;
      ::std::
      _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
                ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)__return_storage_ptr__);
      local_71 = FRAME_END;
      local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
      ::std::
      _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
                ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)__return_storage_ptr__);
    }
  }
  local_70._M_dataplus._M_p._0_1_ = 6;
  sVar5 = ::std::
          _Hashtable<duckdb::WindowBounds,_duckdb::WindowBounds,_std::allocator<duckdb::WindowBounds>,_std::__detail::_Identity,_std::equal_to<duckdb::WindowBounds>,_duckdb::WindowBoundsHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&__return_storage_ptr__->_M_h,(key_type *)&local_70);
  if (sVar5 == 0) {
    local_71 = FRAME_END;
    sVar5 = ::std::
            _Hashtable<duckdb::WindowBounds,_duckdb::WindowBounds,_std::allocator<duckdb::WindowBounds>,_std::__detail::_Identity,_std::equal_to<duckdb::WindowBounds>,_duckdb::WindowBoundsHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::count(&__return_storage_ptr__->_M_h,&local_71);
    if (sVar5 == 0) goto switchD_017bc457_caseD_4;
  }
  local_71 = PARTITION_BEGIN;
  local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
  ::std::
  _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
            ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)__return_storage_ptr__);
  local_71 = PARTITION_END;
  local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
  ::std::
  _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
            ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)__return_storage_ptr__);
  if (wexpr->exclude_clause != NO_OTHER) {
    local_71 = PEER_BEGIN;
    local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
    ::std::
    _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
              ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)__return_storage_ptr__);
    local_71 = PEER_END;
    local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
    ::std::
    _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
              ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)__return_storage_ptr__);
  }
  switch(wexpr->start) {
  case CURRENT_ROW_RANGE:
  case CURRENT_ROW_GROUPS:
    local_71 = PEER_BEGIN;
    local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
    ::std::
    _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
              ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)__return_storage_ptr__);
    break;
  case EXPR_PRECEDING_RANGE:
    local_71 = PEER_BEGIN;
    local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
    ::std::
    _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
              ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)__return_storage_ptr__);
    local_71 = VALID_BEGIN;
    local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
    ::std::
    _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
              ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)__return_storage_ptr__);
    local_71 = VALID_END;
    local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
    ::std::
    _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
              ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)__return_storage_ptr__);
    break;
  case EXPR_FOLLOWING_RANGE:
    local_71 = PEER_BEGIN;
    local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
    ::std::
    _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
              ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)__return_storage_ptr__);
    local_71 = VALID_END;
    local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
    ::std::
    _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
              ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)__return_storage_ptr__);
    break;
  case EXPR_PRECEDING_GROUPS:
    local_71 = PEER_BEGIN;
    local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
    ::std::
    _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
              ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)__return_storage_ptr__);
    break;
  case EXPR_FOLLOWING_GROUPS:
    local_71 = PEER_BEGIN;
    local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
    ::std::
    _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
              ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)__return_storage_ptr__);
  }
  switch(wexpr->end) {
  case CURRENT_ROW_RANGE:
  case CURRENT_ROW_GROUPS:
    local_71 = PEER_END;
    local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
    ::std::
    _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
              ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)__return_storage_ptr__);
    break;
  case EXPR_PRECEDING_RANGE:
    local_71 = PEER_END;
    local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
    ::std::
    _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
              ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)__return_storage_ptr__);
    local_71 = VALID_BEGIN;
    local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
    ::std::
    _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
              ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)__return_storage_ptr__);
    break;
  case EXPR_FOLLOWING_RANGE:
    local_71 = PEER_END;
    local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
    ::std::
    _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
              ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)__return_storage_ptr__);
    local_71 = VALID_BEGIN;
    local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
    ::std::
    _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
              ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)__return_storage_ptr__);
    local_71 = VALID_END;
    local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
    ::std::
    _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
              ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)__return_storage_ptr__);
    break;
  case EXPR_PRECEDING_GROUPS:
    local_71 = PEER_END;
    local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
    ::std::
    _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
              ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)__return_storage_ptr__);
    break;
  case EXPR_FOLLOWING_GROUPS:
    local_71 = PEER_END;
    local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
    ::std::
    _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
              ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)__return_storage_ptr__);
  }
switchD_017bc457_caseD_4:
  local_70._M_dataplus._M_p._0_1_ = 5;
  sVar5 = ::std::
          _Hashtable<duckdb::WindowBounds,_duckdb::WindowBounds,_std::allocator<duckdb::WindowBounds>,_std::__detail::_Identity,_std::equal_to<duckdb::WindowBounds>,_duckdb::WindowBoundsHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&__return_storage_ptr__->_M_h,(key_type *)&local_70);
  if (sVar5 != 0) {
    local_71 = PARTITION_END;
    local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
    ::std::
    _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
              ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)__return_storage_ptr__);
    if ((wexpr->start == EXPR_FOLLOWING_RANGE) || (wexpr->end == EXPR_FOLLOWING_RANGE)) {
      local_71 = VALID_BEGIN;
      local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
      ::std::
      _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
                ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)__return_storage_ptr__);
    }
  }
  local_70._M_dataplus._M_p._0_1_ = 4;
  sVar5 = ::std::
          _Hashtable<duckdb::WindowBounds,_duckdb::WindowBounds,_std::allocator<duckdb::WindowBounds>,_std::__detail::_Identity,_std::equal_to<duckdb::WindowBounds>,_duckdb::WindowBoundsHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&__return_storage_ptr__->_M_h,(key_type *)&local_70);
  if (sVar5 != 0) {
    local_71 = PARTITION_BEGIN;
    local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
    ::std::
    _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
              ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)__return_storage_ptr__);
    local_71 = PARTITION_END;
    local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
    ::std::
    _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
              ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)__return_storage_ptr__);
  }
  local_70._M_dataplus._M_p._0_1_ = 3;
  sVar5 = ::std::
          _Hashtable<duckdb::WindowBounds,_duckdb::WindowBounds,_std::allocator<duckdb::WindowBounds>,_std::__detail::_Identity,_std::equal_to<duckdb::WindowBounds>,_duckdb::WindowBoundsHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&__return_storage_ptr__->_M_h,(key_type *)&local_70);
  if (sVar5 != 0) {
    local_71 = PARTITION_END;
    local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
    ::std::
    _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
              ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)__return_storage_ptr__);
    if (pBVar4 != pBVar3) {
      local_71 = PEER_BEGIN;
      local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
      ::std::
      _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
                ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)__return_storage_ptr__);
    }
  }
  local_70._M_dataplus._M_p._0_1_ = 1;
  sVar5 = ::std::
          _Hashtable<duckdb::WindowBounds,_duckdb::WindowBounds,_std::allocator<duckdb::WindowBounds>,_std::__detail::_Identity,_std::equal_to<duckdb::WindowBounds>,_duckdb::WindowBoundsHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&__return_storage_ptr__->_M_h,(key_type *)&local_70);
  if (((long)puVar1 - (long)puVar2 >> 3 != ((long)pBVar4 - (long)pBVar3 >> 3) * 0x5555555555555555)
     && (sVar5 != 0)) {
    local_71 = PARTITION_BEGIN;
    local_70._M_dataplus._M_p = (pointer)__return_storage_ptr__;
    ::std::
    _Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<duckdb::WindowBounds,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::WindowBounds,true>>>>
              ((_Hashtable<duckdb::WindowBounds,duckdb::WindowBounds,std::allocator<duckdb::WindowBounds>,std::__detail::_Identity,std::equal_to<duckdb::WindowBounds>,duckdb::WindowBoundsHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

WindowBoundsSet WindowBoundariesState::GetWindowBounds(const BoundWindowExpression &wexpr) {
	const auto partition_count = wexpr.partitions.size();
	const auto order_count = wexpr.orders.size();

	WindowBoundsSet result;
	switch (wexpr.GetExpressionType()) {
	case ExpressionType::WINDOW_ROW_NUMBER:
		if (wexpr.arg_orders.empty()) {
			result.insert(PARTITION_BEGIN);
		} else {
			// Secondary orders need to know where the frame is
			result.insert(FRAME_BEGIN);
			result.insert(FRAME_END);
		}
		break;
	case ExpressionType::WINDOW_NTILE:
		if (wexpr.arg_orders.empty()) {
			result.insert(PARTITION_BEGIN);
			result.insert(PARTITION_END);
		} else {
			// Secondary orders need to know where the frame is
			result.insert(FRAME_BEGIN);
			result.insert(FRAME_END);
		}
		break;
	case ExpressionType::WINDOW_RANK:
		if (wexpr.arg_orders.empty()) {
			result.insert(PARTITION_BEGIN);
			result.insert(PEER_BEGIN);
		} else {
			// Secondary orders need to know where the frame is
			result.insert(FRAME_BEGIN);
			result.insert(FRAME_END);
			result.insert(PEER_BEGIN);
		}
		break;
	case ExpressionType::WINDOW_RANK_DENSE:
		result.insert(PARTITION_BEGIN);
		result.insert(PEER_BEGIN);
		break;
	case ExpressionType::WINDOW_PERCENT_RANK:
		if (wexpr.arg_orders.empty()) {
			result.insert(PARTITION_BEGIN);
			result.insert(PARTITION_END);
			result.insert(PEER_BEGIN);
		} else {
			// Secondary orders need to know where the frame is
			result.insert(FRAME_BEGIN);
			result.insert(FRAME_END);
			result.insert(PEER_BEGIN);
		}
		break;
	case ExpressionType::WINDOW_CUME_DIST:
		if (wexpr.arg_orders.empty()) {
			result.insert(PARTITION_BEGIN);
			result.insert(PARTITION_END);
			result.insert(PEER_END);
		} else {
			// Secondary orders need to know where the frame is
			result.insert(FRAME_BEGIN);
			result.insert(FRAME_END);
			result.insert(PEER_END);
		}
		break;
	case ExpressionType::WINDOW_LEAD:
	case ExpressionType::WINDOW_LAG:
		if (wexpr.arg_orders.empty()) {
			result.insert(PARTITION_BEGIN);
			result.insert(PARTITION_END);
		} else {
			// Secondary orders need to know where the frame is
			result.insert(FRAME_BEGIN);
			result.insert(FRAME_END);
		}
		break;
	case ExpressionType::WINDOW_FIRST_VALUE:
	case ExpressionType::WINDOW_LAST_VALUE:
	case ExpressionType::WINDOW_NTH_VALUE:
	case ExpressionType::WINDOW_AGGREGATE:
		result.insert(FRAME_BEGIN);
		result.insert(FRAME_END);
		break;
	default:
		throw InternalException("Window expression type %s", ExpressionTypeToString(wexpr.GetExpressionType()));
	}

	//	Internal dependencies
	if (result.count(FRAME_BEGIN) || result.count(FRAME_END)) {
		result.insert(PARTITION_BEGIN);
		result.insert(PARTITION_END);

		// if we have EXCLUDE GROUP / TIES, we also need peer boundaries
		if (wexpr.exclude_clause != WindowExcludeMode::NO_OTHER) {
			result.insert(PEER_BEGIN);
			result.insert(PEER_END);
		}

		// If the frames are RANGE or GROUPS, then we need peer boundaries
		// If they are preceding or following, RANGE also needs to know
		// where the valid values begin or end.
		switch (wexpr.start) {
		case WindowBoundary::CURRENT_ROW_RANGE:
		case WindowBoundary::CURRENT_ROW_GROUPS:
			result.insert(PEER_BEGIN);
			break;
		case WindowBoundary::EXPR_PRECEDING_RANGE:
			result.insert(PEER_BEGIN);
			result.insert(VALID_BEGIN);
			result.insert(VALID_END);
			break;
		case WindowBoundary::EXPR_FOLLOWING_RANGE:
			result.insert(PEER_BEGIN);
			result.insert(VALID_END);
			break;
		case WindowBoundary::EXPR_PRECEDING_GROUPS:
			result.insert(PEER_BEGIN);
			break;
		case WindowBoundary::EXPR_FOLLOWING_GROUPS:
			result.insert(PEER_BEGIN);
			break;
		case WindowBoundary::UNBOUNDED_PRECEDING:
		case WindowBoundary::UNBOUNDED_FOLLOWING:
		case WindowBoundary::CURRENT_ROW_ROWS:
		case WindowBoundary::EXPR_PRECEDING_ROWS:
		case WindowBoundary::EXPR_FOLLOWING_ROWS:
		case WindowBoundary::INVALID:
			break;
		}

		switch (wexpr.end) {
		case WindowBoundary::CURRENT_ROW_RANGE:
		case WindowBoundary::CURRENT_ROW_GROUPS:
			result.insert(PEER_END);
			break;
		case WindowBoundary::EXPR_PRECEDING_RANGE:
			result.insert(PEER_END);
			result.insert(VALID_BEGIN);
			break;
		case WindowBoundary::EXPR_FOLLOWING_RANGE:
			result.insert(PEER_END);
			result.insert(VALID_BEGIN);
			result.insert(VALID_END);
			break;
		case WindowBoundary::EXPR_PRECEDING_GROUPS:
			result.insert(PEER_END);
			break;
		case WindowBoundary::EXPR_FOLLOWING_GROUPS:
			result.insert(PEER_END);
			break;
		case WindowBoundary::UNBOUNDED_PRECEDING:
		case WindowBoundary::UNBOUNDED_FOLLOWING:
		case WindowBoundary::CURRENT_ROW_ROWS:
		case WindowBoundary::EXPR_PRECEDING_ROWS:
		case WindowBoundary::EXPR_FOLLOWING_ROWS:
		case WindowBoundary::INVALID:
			break;
		}
	}

	if (result.count(VALID_END)) {
		result.insert(PARTITION_END);
		if (HasFollowingRange(wexpr)) {
			result.insert(VALID_BEGIN);
		}
	}
	if (result.count(VALID_BEGIN)) {
		result.insert(PARTITION_BEGIN);
		result.insert(PARTITION_END);
	}
	if (result.count(PEER_END)) {
		result.insert(PARTITION_END);
		if (order_count) {
			result.insert(PEER_BEGIN);
		}
	}
	if (result.count(PARTITION_END) && (partition_count + order_count)) {
		result.insert(PARTITION_BEGIN);
	}

	return result;
}